

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O3

BoundOrderByNode *
duckdb::BoundOrderByNode::Deserialize
          (BoundOrderByNode *__return_storage_ptr__,Deserializer *deserializer)

{
  OrderType type;
  OrderByNullType null_order;
  int iVar1;
  Expression *pEVar2;
  string str;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  undefined1 local_48 [32];
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,100,"type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    type = EnumUtil::FromString<duckdb::OrderType>((char *)local_48._0_8_);
    if ((Expression *)local_48._0_8_ != (Expression *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    type = (OrderType)iVar1;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0x65,"null_order");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    null_order = EnumUtil::FromString<duckdb::OrderByNullType>((char *)local_48._0_8_);
    if ((Expression *)local_48._0_8_ != (Expression *)(local_48 + 0x10)) {
      operator_delete((void *)local_48._0_8_);
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    null_order = (OrderByNullType)iVar1;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  iVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"expression");
  if ((char)iVar1 == '\0') {
    pEVar2 = (Expression *)0x0;
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[10])(deserializer);
    if ((char)iVar1 == '\0') {
      pEVar2 = (Expression *)0x0;
    }
    else {
      (*deserializer->_vptr_Deserializer[6])(deserializer);
      Expression::Deserialize((Expression *)local_48,deserializer);
      (*deserializer->_vptr_Deserializer[7])(deserializer);
      pEVar2 = (Expression *)local_48._0_8_;
    }
    (*deserializer->_vptr_Deserializer[0xb])(deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  local_50._M_head_impl = pEVar2;
  BoundOrderByNode(__return_storage_ptr__,type,null_order,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_50);
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundOrderByNode BoundOrderByNode::Deserialize(Deserializer &deserializer) {
	auto type = deserializer.ReadProperty<OrderType>(100, "type");
	auto null_order = deserializer.ReadProperty<OrderByNullType>(101, "null_order");
	auto expression = deserializer.ReadPropertyWithDefault<unique_ptr<Expression>>(102, "expression");
	BoundOrderByNode result(type, null_order, std::move(expression));
	return result;
}